

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O3

void __thiscall
SuiteSessionTests::TestsessionFixtureSessionIsAnInitiator::RunImpl
          (TestsessionFixtureSessionIsAnInitiator *this)

{
  TestDetails *details;
  sessionFixtureSessionIsAnInitiatorHelper fixtureHelper;
  undefined1 local_660 [1576];
  TestDetails *local_38;
  
  details = &(this->super_Test).m_details;
  TestCallback::TestCallback((TestCallback *)local_660);
  local_660._1568_8_ = FIX::SocketServer::accept;
  local_660._1560_8_ = (Session *)0x0;
  local_660._0_8_ = &PTR__sessionFixture_00328af0;
  local_660._8_8_ = &PTR__sessionFixtureSessionIsAnInitiatorHelper_00328b48;
  local_38 = details;
  UnitTest::ExecuteTest<SuiteSessionTests::sessionFixtureSessionIsAnInitiatorHelper>
            ((sessionFixtureSessionIsAnInitiatorHelper *)local_660,details);
  sessionFixture::~sessionFixture((sessionFixture *)local_660);
  return;
}

Assistant:

TEST_FIXTURE(sessionFixture, SessionIsAnInitiator) {
  createSession(1);
  CHECK(object->isInitiator());
}